

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

QUnifiedTimer * QUnifiedTimer::instance(bool create)

{
  long *plVar1;
  long lVar2;
  QUnifiedTimer *this;
  
  lVar2 = __tls_get_addr(&PTR_006ba338);
  if (*(char *)(lVar2 + 0x70) == '\0') {
    instance();
  }
  if ((create) && (*(long *)(lVar2 + 0x68) == 0)) {
    this = (QUnifiedTimer *)operator_new(0xd0);
    QUnifiedTimer((QUnifiedTimer *)this);
    plVar1 = *(long **)(lVar2 + 0x68);
    *(QUnifiedTimer **)(lVar2 + 0x68) = this;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x20))();
    }
  }
  else {
    this = *(QUnifiedTimer **)(lVar2 + 0x68);
  }
  return this;
}

Assistant:

QUnifiedTimer *QUnifiedTimer::instance(bool create)
{
    QUnifiedTimer *inst;
    static thread_local std::unique_ptr<QUnifiedTimer> unifiedTimer;
    if (create && !unifiedTimer) {
        inst = new QUnifiedTimer;
        unifiedTimer.reset(inst);
    } else {
        inst = unifiedTimer.get();
    }
    return inst;
}